

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

char * fio_sha1_result(fio_sha1_s *s)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (uint)s->length & 0x3f;
  uVar3 = (ulong)uVar2;
  if (uVar3 < 0x38) {
    if (uVar2 == 0x37) {
      s->buffer[0x37] = 0x80;
    }
    else {
      memcpy(s->buffer + uVar3,sha1_padding,0x38 - uVar3);
    }
  }
  else {
    memcpy(s->buffer + uVar3,sha1_padding,0x40 - uVar3);
    fio_sha1_perform_all_rounds(s,s->buffer);
    s->buffer[0x20] = '\0';
    s->buffer[0x21] = '\0';
    s->buffer[0x22] = '\0';
    s->buffer[0x23] = '\0';
    s->buffer[0x24] = '\0';
    s->buffer[0x25] = '\0';
    s->buffer[0x26] = '\0';
    s->buffer[0x27] = '\0';
    s->buffer[0x28] = '\0';
    s->buffer[0x29] = '\0';
    s->buffer[0x2a] = '\0';
    s->buffer[0x2b] = '\0';
    s->buffer[0x2c] = '\0';
    s->buffer[0x2d] = '\0';
    s->buffer[0x2e] = '\0';
    s->buffer[0x2f] = '\0';
    s->buffer[0x10] = '\0';
    s->buffer[0x11] = '\0';
    s->buffer[0x12] = '\0';
    s->buffer[0x13] = '\0';
    s->buffer[0x14] = '\0';
    s->buffer[0x15] = '\0';
    s->buffer[0x16] = '\0';
    s->buffer[0x17] = '\0';
    s->buffer[0x18] = '\0';
    s->buffer[0x19] = '\0';
    s->buffer[0x1a] = '\0';
    s->buffer[0x1b] = '\0';
    s->buffer[0x1c] = '\0';
    s->buffer[0x1d] = '\0';
    s->buffer[0x1e] = '\0';
    s->buffer[0x1f] = '\0';
    s->buffer[0] = '\0';
    s->buffer[1] = '\0';
    s->buffer[2] = '\0';
    s->buffer[3] = '\0';
    s->buffer[4] = '\0';
    s->buffer[5] = '\0';
    s->buffer[6] = '\0';
    s->buffer[7] = '\0';
    s->buffer[8] = '\0';
    s->buffer[9] = '\0';
    s->buffer[10] = '\0';
    s->buffer[0xb] = '\0';
    s->buffer[0xc] = '\0';
    s->buffer[0xd] = '\0';
    s->buffer[0xe] = '\0';
    s->buffer[0xf] = '\0';
    s->buffer[0x30] = '\0';
    s->buffer[0x31] = '\0';
    s->buffer[0x32] = '\0';
    s->buffer[0x33] = '\0';
    s->buffer[0x34] = '\0';
    s->buffer[0x35] = '\0';
    s->buffer[0x36] = '\0';
    s->buffer[0x37] = '\0';
  }
  uVar3 = s->length << 3;
  *(ulong *)(s->buffer + 0x38) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | s->length << 0x3b;
  fio_sha1_perform_all_rounds(s,s->buffer);
  uVar2 = (s->digest).i[0];
  uVar1 = (s->digest).i[1];
  (s->digest).i[0] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
  ;
  (s->digest).i[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
  ;
  uVar2 = (s->digest).i[2];
  (s->digest).i[2] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
  ;
  uVar2 = (s->digest).i[3];
  (s->digest).i[3] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
  ;
  uVar2 = (s->digest).i[4];
  (s->digest).i[4] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
  ;
  return (char *)&s->digest;
}

Assistant:

char *fio_sha1_result(fio_sha1_s *s) {
  size_t in_buffer = s->length & 63;
  if (in_buffer > 55) {
    memcpy(s->buffer + in_buffer, sha1_padding, 64 - in_buffer);
    fio_sha1_perform_all_rounds(s, s->buffer);
    memcpy(s->buffer, sha1_padding + 1, 56);
  } else if (in_buffer != 55) {
    memcpy(s->buffer + in_buffer, sha1_padding, 56 - in_buffer);
  } else {
    s->buffer[55] = sha1_padding[0];
  }
  /* store the length in BITS - alignment should be promised by struct */
  /* this must the number in BITS, encoded as a BIG ENDIAN 64 bit number */
  uint64_t *len = (uint64_t *)(s->buffer + 56);
  *len = s->length << 3;
  *len = fio_lton64(*len);
  fio_sha1_perform_all_rounds(s, s->buffer);

  /* change back to little endian */
  s->digest.i[0] = fio_ntol32(s->digest.i[0]);
  s->digest.i[1] = fio_ntol32(s->digest.i[1]);
  s->digest.i[2] = fio_ntol32(s->digest.i[2]);
  s->digest.i[3] = fio_ntol32(s->digest.i[3]);
  s->digest.i[4] = fio_ntol32(s->digest.i[4]);

  return (char *)s->digest.str;
}